

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O0

bool __thiscall Vector::visit(Vector *this,void *ptr,ValueVisitor *visitor)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  Value local_60;
  Type *local_50;
  size_t i;
  Type *indirect;
  size_t element_count;
  size_t element_size;
  uint8_t *base;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *vector_ptr;
  ValueVisitor *visitor_local;
  void *ptr_local;
  Vector *this_local;
  
  base = (uint8_t *)ptr;
  vector_ptr = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)visitor;
  visitor_local = (ValueVisitor *)ptr;
  ptr_local = this;
  element_size = (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)ptr,0);
  Typelib::Indirect::getIndirection();
  element_count = Typelib::Type::getSize();
  indirect = (Type *)(**(code **)(*(long *)this + 200))(this,base);
  i = Typelib::Indirect::getIndirection();
  for (local_50 = (Type *)0x0; pvVar1 = vector_ptr, local_50 < indirect; local_50 = local_50 + 1) {
    Typelib::Value::Value
              (&local_60,(void *)(element_size + (long)local_50 * element_count),(Type *)i);
    (**(code **)((pvVar1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start + 0x98))
              (pvVar1,local_60.m_data,local_60.m_type.t_);
  }
  return true;
}

Assistant:

bool Vector::visit(void* ptr, ValueVisitor& visitor) const
{
    std::vector<uint8_t>* vector_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(ptr);
    uint8_t* base = &(*vector_ptr)[0];
    size_t   element_size  = getIndirection().getSize();
    size_t   element_count = getElementCount(vector_ptr);
    const Type &indirect(getIndirection());

    for (size_t i = 0; i < element_count; ++i)
        visitor.dispatch(Value(base + i * element_size, indirect));

    return true;
}